

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall
despot::MemoryPool<despot::ChainState>::DeleteAll(MemoryPool<despot::ChainState> *this)

{
  Chunk *this_00;
  pointer ppCVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  
  for (ppCVar3 = (this->chunks_).
                 super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppCVar3 !=
      (this->chunks_).
      super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppCVar3 = ppCVar3 + 1) {
    this_00 = *ppCVar3;
    if (this_00 != (Chunk *)0x0) {
      Chunk::~Chunk(this_00);
    }
    operator_delete(this_00,0x5800);
  }
  ppCVar1 = (this->chunks_).
            super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar3 != ppCVar1) {
    (this->chunks_).
    super__Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppCVar1;
  }
  ppCVar2 = (this->freelist_).
            super__Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->freelist_).
      super__Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar2) {
    (this->freelist_).
    super__Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppCVar2;
  }
  this->num_allocated_ = 0;
  return;
}

Assistant:

void DeleteAll() {
		for (chunk_iterator_ i_chunk = chunks_.begin();
			i_chunk != chunks_.end(); ++i_chunk)
			delete *i_chunk;
		chunks_.clear();
		freelist_.clear();
		num_allocated_ = 0;
	}